

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_enumerator.cpp
# Opt level: O0

SharedLiterals * __thiscall
Clasp::CBConsequences::SharedConstraint::fetch_if_neq(SharedConstraint *this,SharedLiterals *last)

{
  int iVar1;
  SharedLiterals *pSVar2;
  long in_RSI;
  long *in_RDI;
  SharedLiterals *ret;
  SharedLiterals *in_stack_ffffffffffffffb0;
  __atomic_base<int> *this_00;
  
  while( true ) {
    this_00 = (__atomic_base<int> *)(in_RDI + 1);
    LOCK();
    iVar1 = this_00->_M_i;
    this_00->_M_i = 1;
    UNLOCK();
    if (iVar1 == 0) break;
    std::this_thread::yield();
  }
  if (in_RSI == *in_RDI) {
    pSVar2 = (SharedLiterals *)0x0;
  }
  else {
    pSVar2 = SharedLiterals::share(in_stack_ffffffffffffffb0);
  }
  std::__atomic_base<int>::operator=(this_00,(__int_type_conflict)((ulong)pSVar2 >> 0x20));
  return pSVar2;
}

Assistant:

SharedLiterals* fetch_if_neq(SharedLiterals* last) const {
		ACQUIRE_LOCK(mutex);
		SharedLiterals* ret = last != current ? current->share() : 0;
		RELEASE_LOCK(mutex);
		return ret;
	}